

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

Instance *
instance_copy(Instance *__return_storage_ptr__,Instance *instance,_Bool allocate,_Bool deep_copy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  double *__dest;
  double *__dest_00;
  Vec2d *__dest_01;
  char *pcVar4;
  undefined7 in_register_00000011;
  long lVar5;
  double *local_48;
  
  __return_storage_ptr__->demands = (double *)0x0;
  __return_storage_ptr__->profits = (double *)0x0;
  *(undefined8 *)&__return_storage_ptr__->rounding_strat = 0;
  __return_storage_ptr__->positions = (Vec2d *)0x0;
  __return_storage_ptr__->num_customers = 0;
  __return_storage_ptr__->num_vehicles = 0;
  __return_storage_ptr__->vehicle_cap = 0.0;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->comment = (char *)0x0;
  __return_storage_ptr__->edge_weight = (double *)0x0;
  uVar1 = instance->num_customers;
  uVar2 = instance->num_vehicles;
  iVar3 = uVar1 + 1;
  __return_storage_ptr__->num_customers = uVar1;
  __return_storage_ptr__->num_vehicles = uVar2;
  __return_storage_ptr__->vehicle_cap = instance->vehicle_cap;
  lVar5 = (long)iVar3;
  if ((int)CONCAT71(in_register_00000011,allocate) == 0) {
    local_48 = (double *)0x0;
    __dest_01 = (Vec2d *)0x0;
    __dest_00 = (double *)0x0;
    __dest = (double *)0x0;
  }
  else {
    if (instance->edge_weight == (double *)0x0) {
      local_48 = (double *)0x0;
    }
    else {
      local_48 = (double *)malloc((long)((iVar3 * uVar1) / 2) << 3);
      __return_storage_ptr__->edge_weight = local_48;
    }
    __dest = (double *)malloc(lVar5 * 8);
    __return_storage_ptr__->profits = __dest;
    __dest_00 = (double *)malloc(lVar5 * 8);
    __return_storage_ptr__->demands = __dest_00;
    __dest_01 = (Vec2d *)malloc(lVar5 << 4);
    __return_storage_ptr__->positions = __dest_01;
    pcVar4 = strdup(instance->name);
    __return_storage_ptr__->name = pcVar4;
    pcVar4 = strdup(instance->comment);
    __return_storage_ptr__->comment = pcVar4;
  }
  if (deep_copy) {
    memcpy(__dest,instance->profits,lVar5 * 8);
    memcpy(__dest_00,instance->demands,lVar5 * 8);
    memcpy(__dest_01,instance->positions,lVar5 << 4);
    if (instance->edge_weight != (double *)0x0) {
      memcpy(local_48,instance->edge_weight,(long)((iVar3 * uVar1) / 2) << 3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Instance instance_copy(const Instance *instance, bool allocate,
                       bool deep_copy) {
    Instance result = {0};
    int32_t n = instance->num_customers + 1;

    result.num_customers = instance->num_customers;
    result.num_vehicles = instance->num_vehicles;
    result.vehicle_cap = instance->vehicle_cap;

    if (allocate) {
        if (instance->edge_weight) {
            result.edge_weight =
                malloc(sizeof(*instance->edge_weight) * hm_nentries(n));
        }

        result.profits = malloc(n * sizeof(*result.profits));
        result.demands = malloc(n * sizeof(*result.demands));
        result.positions = malloc(n * sizeof(*result.positions));

        result.name = strdup(instance->name);
        result.comment = strdup(instance->comment);
    }

    if (deep_copy) {
        memcpy(result.profits, instance->profits, n * sizeof(*result.profits));
        memcpy(result.demands, instance->demands, n * sizeof(*result.demands));
        memcpy(result.positions, instance->positions,
               n * sizeof(*result.positions));

        if (instance->edge_weight) {
            memcpy(result.edge_weight, instance->edge_weight,
                   hm_nentries(n) * sizeof(*result.edge_weight));
        }
    }

    return result;
}